

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall S2Loop::BoundaryNear(S2Loop *this,S2Loop *b,S1Angle max_error)

{
  int i;
  int iVar1;
  size_type sVar2;
  S2Point *pSVar3;
  S2Point *pSVar4;
  S2Point *b_00;
  int iVar5;
  int iVar6;
  int iVar7;
  pair<int,_int> pVar8;
  pair<int,_int> pVar9;
  S1Angle SVar10;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> pending;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  done;
  pair<int,_int> local_b0;
  S2Loop *local_a8;
  uint local_9c;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_98;
  double local_78;
  ulong local_70;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_68;
  S2Point *local_38;
  
  iVar5 = this->num_vertices_;
  if (iVar5 == 1) {
    if ((this->origin_inside_ & 1U) == 0) {
      local_9c = (uint)((b->origin_inside_ ^ 1U) & b->num_vertices_ == 1);
    }
    else {
      local_9c = (uint)(byte)(b->num_vertices_ == 1 & b->origin_inside_);
    }
  }
  else {
    local_9c = 0;
    if (b->num_vertices_ != 1) {
      local_70 = 0;
      local_a8 = this;
      local_78 = max_error.radians_;
      while( true ) {
        local_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_68._M_impl.super__Rb_tree_header._M_header;
        if (iVar5 <= (int)local_70) break;
        local_9c = (uint)CONCAT71((int7)(local_70 >> 8),(int)local_70 < iVar5);
        local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.first = 0;
        local_b0.second = 0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right =
             local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_98,
                   &local_b0);
        while (local_98._M_impl.super__Vector_impl_data._M_start !=
               local_98._M_impl.super__Vector_impl_data._M_finish) {
          iVar5 = local_98._M_impl.super__Vector_impl_data._M_finish[-1].first;
          i = local_98._M_impl.super__Vector_impl_data._M_finish[-1].second;
          if ((iVar5 == local_a8->num_vertices_) && (i == b->num_vertices_)) {
            local_98._M_impl.super__Vector_impl_data._M_finish =
                 local_98._M_impl.super__Vector_impl_data._M_finish + -1;
            std::
            _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::~_Rb_tree(&local_68);
            std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            ~_Vector_base(&local_98);
            goto LAB_0023d82f;
          }
          local_b0 = local_98._M_impl.super__Vector_impl_data._M_finish[-1];
          local_98._M_impl.super__Vector_impl_data._M_finish =
               local_98._M_impl.super__Vector_impl_data._M_finish + -1;
          std::
          _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
          ::_M_insert_unique<std::pair<int,int>>
                    ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                      *)&local_68,&local_b0);
          iVar7 = iVar5 + (int)local_70;
          iVar1 = local_a8->num_vertices_;
          iVar6 = iVar1;
          if (iVar7 < iVar1) {
            iVar6 = 0;
          }
          iVar7 = iVar7 - iVar6;
          if (iVar5 < iVar1) {
            pVar9.second = i;
            pVar9.first = iVar5 + 1;
            local_b0 = pVar9;
            sVar2 = std::
                    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    ::count((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                             *)&local_68,&local_b0);
            if (sVar2 == 0) {
              local_38 = vertex(local_a8,iVar7 + 1);
              pSVar3 = vertex(b,i);
              pSVar4 = vertex(b,i + 1);
              SVar10 = S2::GetDistance(local_38,pSVar3,pSVar4);
              if (SVar10.radians_ <= local_78) {
                local_b0 = pVar9;
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                emplace_back<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_98,&local_b0);
              }
            }
          }
          if (i < b->num_vertices_) {
            pVar8.second = i + 1;
            pVar8.first = iVar5;
            local_b0 = pVar8;
            sVar2 = std::
                    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    ::count((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                             *)&local_68,&local_b0);
            if (sVar2 == 0) {
              pSVar3 = vertex(b,i + 1);
              pSVar4 = vertex(local_a8,iVar7);
              b_00 = vertex(local_a8,iVar7 + 1);
              SVar10 = S2::GetDistance(pSVar3,pSVar4,b_00);
              if (SVar10.radians_ <= local_78) {
                local_b0 = pVar8;
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                emplace_back<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_98,&local_b0);
              }
            }
          }
        }
        std::
        _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        ::~_Rb_tree(&local_68);
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  (&local_98);
        local_70 = (ulong)((int)local_70 + 1);
        iVar5 = local_a8->num_vertices_;
      }
      local_9c = 0;
    }
  }
LAB_0023d82f:
  return SUB41(local_9c,0);
}

Assistant:

bool S2Loop::BoundaryNear(const S2Loop& b, S1Angle max_error) const {
  // Special case to handle empty or full loops.
  if (is_empty_or_full() || b.is_empty_or_full()) {
    return (is_empty() && b.is_empty()) || (is_full() && b.is_full());
  }

  for (int a_offset = 0; a_offset < num_vertices(); ++a_offset) {
    if (MatchBoundaries(*this, b, a_offset, max_error)) return true;
  }
  return false;
}